

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

ProStringList * __thiscall
MakefileGenerator::findFilesInVPATH
          (MakefileGenerator *this,ProStringList *l,uchar flags,QString *vpath_var)

{
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  reference this_00;
  ulong uVar4;
  char *pcVar5;
  byte in_CL;
  QList<ProString> *in_RDX;
  ProStringList *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  QStringBuilder<QString_&,_char> QVar7;
  int i;
  bool found;
  ProString *val;
  bool remove_file;
  int val_it;
  ProValueMap *v;
  QString a;
  QStringList files;
  QString real_dir_1;
  QString regex;
  QString dir_1;
  ProString dir;
  QString real_dir;
  Iterator vpath_it;
  QString file;
  QString qval;
  ProStringList vpath;
  undefined4 in_stack_fffffffffffff958;
  FileFixifyType in_stack_fffffffffffff95c;
  ProString *in_stack_fffffffffffff960;
  ProKey *in_stack_fffffffffffff968;
  ProString *in_stack_fffffffffffff970;
  MakefileGenerator *in_stack_fffffffffffff978;
  undefined6 in_stack_fffffffffffff980;
  byte in_stack_fffffffffffff986;
  undefined1 in_stack_fffffffffffff987;
  QMap<ProKey,_ProStringList> *in_stack_fffffffffffff988;
  char *in_stack_fffffffffffff998;
  int in_stack_fffffffffffffa04;
  QFlagsStorage<QDir::Filter> in_stack_fffffffffffffa08;
  uint in_stack_fffffffffffffa0c;
  iterator in_stack_fffffffffffffa10;
  int local_5e4;
  int local_5d4;
  undefined1 local_430 [24];
  QDir local_418 [8];
  QList<QString> local_410 [2];
  undefined1 local_3dd;
  QString local_390;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  QString local_360 [7];
  QStringBuilder<ProString_&,_ProString_&> local_2b0;
  undefined1 local_2a0 [48];
  QString *local_270;
  char local_268;
  undefined1 local_259;
  char local_228 [24];
  iterator local_210 [25];
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_fffffffffffffebc;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  QString *local_30;
  char local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 0xaaaaaaaaaaaaaaaa;
  local_60 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  ProStringList::ProStringList((ProStringList *)0x17782a);
  QMakeProject::variables((QMakeProject *)0x177850);
  local_5d4 = 0;
LAB_00177863:
  qVar3 = QList<ProString>::size(in_RDX);
  if (qVar3 <= local_5d4) {
    ProStringList::ProStringList
              ((ProStringList *)in_stack_fffffffffffff960,
               (ProStringList *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    ProStringList::~ProStringList((ProStringList *)0x1788d5);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return in_RDI;
    }
    __stack_chk_fail();
  }
  bVar6 = false;
  this_00 = QList<ProString>::operator[]
                      ((QList<ProString> *)in_stack_fffffffffffff960,
                       CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
  bVar1 = ProString::isEmpty(this_00);
  if (!bVar1) goto code_r0x001778da;
  goto LAB_00178872;
code_r0x001778da:
  local_80 = 0xaaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaaaaaaaaaa;
  local_70 = 0xaaaaaaaaaaaaaaaa;
  ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
  fixEnvVariables((QString *)in_stack_fffffffffffff968);
  bVar1 = QString::isEmpty((QString *)0x17796b);
  if (bVar1) {
    local_5d4 = local_5d4 + 1;
    local_5e4 = 3;
  }
  else {
    if ((in_CL & 4) == 0) {
      QFlags<MakefileGenerator::FileFixifyType>::QFlags
                ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffff960,
                 in_stack_fffffffffffff95c);
      fileFixify((MakefileGenerator *)in_stack_fffffffffffffa10.i,
                 (QString *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08.i),
                 (FileFixifyTypes)in_stack_fffffffffffffebc.i,
                 SUB41((uint)in_stack_fffffffffffffa04 >> 0x18,0));
      QString::operator=(&in_stack_fffffffffffff960->m_string,
                         (QString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
      QString::~QString((QString *)0x177a00);
    }
    QString::QString(&in_stack_fffffffffffff960->m_string,
                     (QString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    bVar1 = exists(in_stack_fffffffffffff978,&in_stack_fffffffffffff970->m_string);
    QString::~QString((QString *)0x177a3b);
    if (bVar1) {
      local_5d4 = local_5d4 + 1;
      local_5e4 = 3;
    }
    else {
      bVar1 = false;
      uVar4 = QDir::isRelativePath((QString *)&local_80);
      if ((uVar4 & 1) != 0) {
        bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x177a91);
        if (bVar2) {
          bVar2 = QString::isEmpty((QString *)0x177aa7);
          if (!bVar2) {
            ProKey::ProKey(in_stack_fffffffffffff968,&in_stack_fffffffffffff960->m_string);
            QMap<ProKey,_ProStringList>::operator[]
                      (in_stack_fffffffffffff988,
                       (ProKey *)
                       CONCAT17(in_stack_fffffffffffff987,
                                CONCAT16(in_stack_fffffffffffff986,in_stack_fffffffffffff980)));
            ProStringList::operator=
                      ((ProStringList *)in_stack_fffffffffffff960,
                       (ProStringList *)
                       CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            ProStringList::~ProStringList((ProStringList *)0x177b09);
            ProKey::~ProKey((ProKey *)0x177b16);
          }
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff960,
                         (char *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          QMap<ProKey,_ProStringList>::operator[]
                    (in_stack_fffffffffffff988,
                     (ProKey *)
                     CONCAT17(in_stack_fffffffffffff987,
                              CONCAT16(in_stack_fffffffffffff986,in_stack_fffffffffffff980)));
          ProKey::ProKey((ProKey *)in_stack_fffffffffffff960,
                         (char *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          QMap<ProKey,_ProStringList>::operator[]
                    (in_stack_fffffffffffff988,
                     (ProKey *)
                     CONCAT17(in_stack_fffffffffffff987,
                              CONCAT16(in_stack_fffffffffffff986,in_stack_fffffffffffff980)));
          ::operator+((ProStringList *)in_stack_fffffffffffff978,
                      (ProStringList *)in_stack_fffffffffffff970);
          QList<ProString>::operator+=
                    ((QList<ProString> *)in_stack_fffffffffffff960,
                     (QList<ProString> *)
                     CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          ProStringList::~ProStringList((ProStringList *)0x177bcb);
          ProStringList::~ProStringList((ProStringList *)0x177bd8);
          ProKey::~ProKey((ProKey *)0x177be5);
          ProStringList::~ProStringList((ProStringList *)0x177bf2);
          ProKey::~ProKey((ProKey *)0x177bff);
          qmake_getpwd();
          bVar2 = ::operator!=(&in_stack_fffffffffffff960->m_string,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          QString::~QString((QString *)0x177c31);
          if (bVar2) {
            ProString::ProString
                      (in_stack_fffffffffffff960,
                       (QString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            ProStringList::operator<<
                      ((ProStringList *)in_stack_fffffffffffff960,
                       (ProString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            ProString::~ProString((ProString *)0x177c71);
          }
        }
        local_210[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_210[0] = QList<ProString>::begin(in_stack_fffffffffffff960);
        while( true ) {
          in_stack_fffffffffffffa10 = QList<ProString>::end(in_stack_fffffffffffff960);
          bVar2 = QList<ProString>::iterator::operator!=(local_210,in_stack_fffffffffffffa10);
          if (!bVar2) break;
          local_228[0] = -0x56;
          local_228[1] = -0x56;
          local_228[2] = -0x56;
          local_228[3] = -0x56;
          local_228[4] = -0x56;
          local_228[5] = -0x56;
          local_228[6] = -0x56;
          local_228[7] = -0x56;
          local_228[8] = -0x56;
          local_228[9] = -0x56;
          local_228[10] = -0x56;
          local_228[0xb] = -0x56;
          local_228[0xc] = -0x56;
          local_228[0xd] = -0x56;
          local_228[0xe] = -0x56;
          local_228[0xf] = -0x56;
          local_228[0x10] = -0x56;
          local_228[0x11] = -0x56;
          local_228[0x12] = -0x56;
          local_228[0x13] = -0x56;
          local_228[0x14] = -0x56;
          local_228[0x15] = -0x56;
          local_228[0x16] = -0x56;
          local_228[0x17] = -0x56;
          QList<ProString>::iterator::operator*(local_210);
          ProString::toQString
                    ((ProString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          in_stack_fffffffffffff998 = local_228;
          Option::normalizePath
                    ((QString *)in_stack_fffffffffffff978,
                     SUB81((ulong)in_stack_fffffffffffff970 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffff970 >> 0x30,0));
          QString::~QString((QString *)0x177d35);
          local_259 = 0x2f;
          QVar7 = ::operator+((QString *)in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960
                             );
          local_270 = QVar7.a;
          local_268 = QVar7.b;
          local_30 = local_270;
          local_28 = local_268;
          ::operator+((QStringBuilder<QString_&,_char> *)in_stack_fffffffffffff960,
                      (ProString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QStringBuilder<QString_&,_char>,_ProString_&> *)
                     CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          bVar2 = exists(in_stack_fffffffffffff978,&in_stack_fffffffffffff970->m_string);
          QString::~QString((QString *)0x177dd4);
          if (bVar2) {
            memset(local_2a0,0xaa,0x30);
            QList<ProString>::iterator::operator*(local_210);
            ProString::ProString
                      (in_stack_fffffffffffff960,
                       (ProString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            bVar1 = ProString::endsWith(in_stack_fffffffffffff970,
                                        (QString *)in_stack_fffffffffffff968,
                                        (CaseSensitivity)((ulong)in_stack_fffffffffffff960 >> 0x20))
            ;
            if (!bVar1) {
              ProString::operator+=
                        (in_stack_fffffffffffff960,
                         (QString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            }
            local_2b0 = ::operator+(in_stack_fffffffffffff960,
                                    (ProString *)
                                    CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            ProString::operator=
                      ((ProString *)
                       CONCAT17(in_stack_fffffffffffff987,
                                CONCAT16(in_stack_fffffffffffff986,in_stack_fffffffffffff980)),
                       (QStringBuilder<ProString_&,_ProString_&> *)in_stack_fffffffffffff978);
            if ((in_CL & 4) == 0) {
              ProString::toQString
                        ((ProString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958))
              ;
              QFlags<MakefileGenerator::FileFixifyType>::QFlags
                        ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffff960,
                         in_stack_fffffffffffff95c);
              fileFixify((MakefileGenerator *)in_stack_fffffffffffffa10.i,
                         (QString *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08.i),
                         (FileFixifyTypes)in_stack_fffffffffffffebc.i,
                         SUB41((uint)in_stack_fffffffffffffa04 >> 0x18,0));
              ProString::ProString
                        (in_stack_fffffffffffff960,
                         (QString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
              ProString::operator=
                        (in_stack_fffffffffffff960,
                         (ProString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958))
              ;
              ProString::~ProString((ProString *)0x177f19);
              QString::~QString((QString *)0x177f26);
              QString::~QString((QString *)0x177f33);
            }
            bVar1 = true;
            if (Option::debug_level != 0) {
              QString::toLatin1((QString *)
                                CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
              in_stack_fffffffffffff988 =
                   (QMap<ProKey,_ProStringList> *)QByteArray::constData((QByteArray *)0x177f69);
              ProString::toLatin1((ProString *)in_stack_fffffffffffff978);
              pcVar5 = QByteArray::constData((QByteArray *)0x177f90);
              debug_msg_internal(1,"Found file through vpath %s -> %s",in_stack_fffffffffffff988,
                                 pcVar5);
              QByteArray::~QByteArray((QByteArray *)0x177fb8);
              QByteArray::~QByteArray((QByteArray *)0x177fc5);
            }
            bVar2 = true;
            ProString::~ProString((ProString *)0x177fdd);
          }
          else {
            bVar2 = false;
          }
          QString::~QString((QString *)0x177ff7);
          if (bVar2) break;
          QList<ProString>::iterator::operator++(local_210);
        }
      }
      if (!bVar1) {
        local_360[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_360[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_360[0].d.size = -0x5555555555555556;
        QString::QString((QString *)0x178064);
        local_378 = 0xaaaaaaaaaaaaaaaa;
        local_370 = 0xaaaaaaaaaaaaaaaa;
        local_368 = 0xaaaaaaaaaaaaaaaa;
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
        local_390.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_390.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_390.d.size = -0x5555555555555556;
        QString::QString((QString *)0x1780e0);
        qVar3 = QString::lastIndexOf
                          (&in_stack_fffffffffffff970->m_string,(QString *)in_stack_fffffffffffff968
                           ,(CaseSensitivity)((ulong)in_stack_fffffffffffff960 >> 0x20));
        if (qVar3 != -1) {
          QString::lastIndexOf
                    (&in_stack_fffffffffffff970->m_string,(QString *)in_stack_fffffffffffff968,
                     (CaseSensitivity)((ulong)in_stack_fffffffffffff960 >> 0x20));
          QString::left((QString *)in_stack_fffffffffffff978,(qsizetype)in_stack_fffffffffffff970);
          QString::operator=(&in_stack_fffffffffffff960->m_string,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          QString::~QString((QString *)0x17815a);
          QString::operator=(&local_390,(QString *)local_360);
          if ((in_CL & 4) == 0) {
            QFlags<MakefileGenerator::FileFixifyType>::QFlags
                      ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffff960,
                       in_stack_fffffffffffff95c);
            fileFixify((MakefileGenerator *)in_stack_fffffffffffffa10.i,
                       (QString *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08.i),
                       (FileFixifyTypes)in_stack_fffffffffffffebc.i,
                       SUB41((uint)in_stack_fffffffffffffa04 >> 0x18,0));
            local_3dd = 0x2f;
            ::operator+((QString *)in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QString,_char> *)
                       CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            QString::operator=(&in_stack_fffffffffffff960->m_string,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            QString::~QString((QString *)0x17821b);
            QStringBuilder<QString,_char>::~QStringBuilder
                      ((QStringBuilder<QString,_char> *)0x178228);
            QString::~QString((QString *)0x178235);
          }
          QString::size(local_360);
          QString::remove((longlong)&local_378,0);
        }
        bVar1 = QString::isEmpty((QString *)0x178263);
        in_stack_fffffffffffffa0c = in_stack_fffffffffffffa0c & 0xffffff;
        in_stack_fffffffffffff986 = true;
        if (!bVar1) {
          QString::QString(&in_stack_fffffffffffff960->m_string,
                           (QString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958))
          ;
          in_stack_fffffffffffffa0c = CONCAT13(1,(int3)in_stack_fffffffffffffa0c);
          in_stack_fffffffffffff986 =
               exists(in_stack_fffffffffffff978,&in_stack_fffffffffffff970->m_string);
        }
        in_stack_fffffffffffff987 = in_stack_fffffffffffff986;
        if ((in_stack_fffffffffffffa0c & 0x1000000) != 0) {
          QString::~QString((QString *)0x1782cf);
        }
        if ((in_stack_fffffffffffff986 & 1) == 0) {
          if (Option::debug_level != 0) {
            QString::toLatin1((QString *)
                              CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            in_stack_fffffffffffff960 = (ProString *)QByteArray::constData((QByteArray *)0x178709);
            QString::toLatin1((QString *)
                              CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            in_stack_fffffffffffff968 = (ProKey *)QByteArray::constData((QByteArray *)0x178730);
            QString::toLatin1((QString *)
                              CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
            pcVar5 = QByteArray::constData((QByteArray *)0x178757);
            debug_msg_internal(1,"makefile.cpp:%d Cannot match %s%s, as %s does not exist.",0x13c,
                               in_stack_fffffffffffff960,in_stack_fffffffffffff968,pcVar5);
            QByteArray::~QByteArray((QByteArray *)0x178789);
            QByteArray::~QByteArray((QByteArray *)0x178796);
            QByteArray::~QByteArray((QByteArray *)0x1787a3);
          }
          bVar6 = (in_CL & 2) != 0;
          if ((in_CL & 1) != 0) {
            ProString::toLatin1((ProString *)in_stack_fffffffffffff978);
            pcVar5 = QByteArray::constData((QByteArray *)0x1787ed);
            warn_msg(WarnLogic,"Failure to find: %s",pcVar5);
            QByteArray::~QByteArray((QByteArray *)0x178810);
          }
        }
        else {
          local_410[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_410[0].d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
          local_410[0].d.size = -0x5555555555555556;
          QDir::QDir(local_418,(QString *)&local_390);
          QList<QString>::QList<QString,void>
                    ((QList<QString> *)in_stack_fffffffffffff960,
                     (QString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
          in_stack_fffffffffffffa08.i =
               (Int)operator|((enum_type)((ulong)in_stack_fffffffffffff960 >> 0x20),
                              (enum_type)in_stack_fffffffffffff960);
          QFlags<QDir::SortFlag>::QFlags
                    ((QFlags<QDir::SortFlag> *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c);
          QDir::entryList((QList_conflict2 *)local_410,(QFlags_conflict *)local_418,
                          (QFlags_conflict *)local_430);
          QList<QString>::~QList((QList<QString> *)0x178394);
          QDir::~QDir(local_418);
          bVar1 = QList<QString>::isEmpty((QList<QString> *)0x1783ae);
          if (bVar1) {
            if (Option::debug_level != 0) {
              ProString::toLatin1((ProString *)in_stack_fffffffffffff978);
              in_stack_fffffffffffff978 =
                   (MakefileGenerator *)QByteArray::constData((QByteArray *)0x1783e9);
              QString::QString((QString *)in_stack_fffffffffffff968,in_stack_fffffffffffff998);
              ProStringList::join((ProStringList *)in_stack_fffffffffffff978,
                                  &in_stack_fffffffffffff970->m_string);
              QString::toLatin1((QString *)
                                CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
              pcVar5 = QByteArray::constData((QByteArray *)0x178441);
              debug_msg_internal(1,"makefile.cpp:%d Failure to find %s in vpath (%s)",0x12a,
                                 in_stack_fffffffffffff978,pcVar5);
              QByteArray::~QByteArray((QByteArray *)0x17846e);
              QString::~QString((QString *)0x17847b);
              QString::~QString((QString *)0x178488);
              QByteArray::~QByteArray((QByteArray *)0x178495);
            }
            bVar6 = (in_CL & 2) != 0;
            if ((in_CL & 1) != 0) {
              ProString::toLatin1((ProString *)in_stack_fffffffffffff978);
              pcVar5 = QByteArray::constData((QByteArray *)0x1784df);
              warn_msg(WarnLogic,"Failure to find: %s",pcVar5);
              QByteArray::~QByteArray((QByteArray *)0x178502);
            }
          }
          else {
            ProStringList::removeAt
                      ((ProStringList *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c);
            QString::QString((QString *)0x178555);
            qVar3 = QList<QString>::size(local_410);
            in_stack_fffffffffffffa04 = (int)qVar3;
            while (in_stack_fffffffffffffa04 = in_stack_fffffffffffffa04 + -1,
                  -1 < in_stack_fffffffffffffa04) {
              QList<QString>::operator[]
                        ((QList<QString> *)in_stack_fffffffffffff960,
                         CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
              ::operator+(&in_stack_fffffffffffff960->m_string,
                          (QString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QString_&,_QString_&> *)
                         CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
              QString::operator=(&in_stack_fffffffffffff960->m_string,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
              QString::~QString((QString *)0x1785e6);
              if ((in_CL & 4) == 0) {
                QFlags<MakefileGenerator::FileFixifyType>::QFlags
                          ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffff960,
                           in_stack_fffffffffffff95c);
                fileFixify((MakefileGenerator *)in_stack_fffffffffffffa10.i,
                           (QString *)
                           CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08.i),
                           (FileFixifyTypes)in_stack_fffffffffffffebc.i,
                           SUB41((uint)in_stack_fffffffffffffa04 >> 0x18,0));
                QString::operator=(&in_stack_fffffffffffff960->m_string,
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
                QString::~QString((QString *)0x178651);
              }
              in_stack_fffffffffffff970 = (ProString *)(long)local_5d4;
              ProString::ProString
                        (in_stack_fffffffffffff960,
                         (QString *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
              QList<ProString>::insert
                        ((QList<ProString> *)in_stack_fffffffffffff968,
                         (qsizetype)in_stack_fffffffffffff960,
                         (rvalue_ref)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
              ProString::~ProString((ProString *)0x1786a2);
            }
            QString::~QString((QString *)0x1786c5);
          }
          QList<QString>::~QList((QList<QString> *)0x1786d2);
        }
        QString::~QString((QString *)0x17881f);
        QString::~QString((QString *)0x17882c);
        QString::~QString((QString *)0x178839);
      }
      local_5e4 = 0;
    }
  }
  QString::~QString((QString *)0x178851);
  QString::~QString((QString *)0x17885e);
  if (local_5e4 == 0) {
LAB_00178872:
    if (bVar6) {
      ProStringList::removeAt((ProStringList *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c);
    }
    else {
      local_5d4 = local_5d4 + 1;
    }
  }
  goto LAB_00177863;
}

Assistant:

ProStringList
MakefileGenerator::findFilesInVPATH(ProStringList l, uchar flags, const QString &vpath_var)
{
    ProStringList vpath;
    const ProValueMap &v = project->variables();
    for(int val_it = 0; val_it < l.size(); ) {
        bool remove_file = false;
        ProString &val = l[val_it];
        if(!val.isEmpty()) {
            QString qval = val.toQString();
            QString file = fixEnvVariables(qval);
            if (file.isEmpty()) {
                ++val_it;
                continue;
            }
            if(!(flags & VPATH_NoFixify))
                file = fileFixify(file, FileFixifyBackwards);

            if(exists(file)) {
                ++val_it;
                continue;
            }
            bool found = false;
            if (QDir::isRelativePath(qval)) {
                if(vpath.isEmpty()) {
                    if(!vpath_var.isEmpty())
                        vpath = v[ProKey(vpath_var)];
                    vpath += v["VPATH"] + v["QMAKE_ABSOLUTE_SOURCE_PATH"];
                    if(Option::output_dir != qmake_getpwd())
                        vpath << Option::output_dir;
                }
                for (ProStringList::Iterator vpath_it = vpath.begin();
                    vpath_it != vpath.end(); ++vpath_it) {
                    QString real_dir = Option::normalizePath((*vpath_it).toQString());
                    if (exists(real_dir + '/' + val)) {
                        ProString dir = (*vpath_it);
                        if(!dir.endsWith(Option::dir_sep))
                            dir += Option::dir_sep;
                        val = dir + val;
                        if(!(flags & VPATH_NoFixify))
                            val = fileFixify(val.toQString());
                        found = true;
                        debug_msg(1, "Found file through vpath %s -> %s",
                                  file.toLatin1().constData(), val.toLatin1().constData());
                        break;
                    }
                }
            }
            if(!found) {
                QString dir, regex = val.toQString(), real_dir;
                if(regex.lastIndexOf(Option::dir_sep) != -1) {
                    dir = regex.left(regex.lastIndexOf(Option::dir_sep) + 1);
                    real_dir = dir;
                    if(!(flags & VPATH_NoFixify))
                        real_dir = fileFixify(real_dir, FileFixifyBackwards) + '/';
                    regex.remove(0, dir.size());
                }
                if(real_dir.isEmpty() || exists(real_dir)) {
                    QStringList files = QDir(real_dir).entryList(QStringList(regex),
                                                QDir::NoDotAndDotDot | QDir::AllEntries);
                    if(files.isEmpty()) {
                        debug_msg(1, "makefile.cpp:%d Failure to find %s in vpath (%s)",
                                  __LINE__, val.toLatin1().constData(),
                                  vpath.join(QString("::")).toLatin1().constData());
                        if (flags & VPATH_RemoveMissingFiles)
                            remove_file = true;
                        if (flags & VPATH_WarnMissingFiles)
                            warn_msg(WarnLogic, "Failure to find: %s", val.toLatin1().constData());
                    } else {
                        l.removeAt(val_it);
                        QString a;
                        for(int i = (int)files.size()-1; i >= 0; i--) {
                            a = real_dir + files[i];
                            if(!(flags & VPATH_NoFixify))
                                a = fileFixify(a);
                            l.insert(val_it, a);
                        }
                    }
                } else {
                    debug_msg(1, "makefile.cpp:%d Cannot match %s%s, as %s does not exist.",
                              __LINE__, real_dir.toLatin1().constData(),
                              regex.toLatin1().constData(), real_dir.toLatin1().constData());
                    if (flags & VPATH_RemoveMissingFiles)
                        remove_file = true;
                    if (flags & VPATH_WarnMissingFiles)
                        warn_msg(WarnLogic, "Failure to find: %s", val.toLatin1().constData());
                }
            }
        }
        if(remove_file)
            l.removeAt(val_it);
        else
            ++val_it;
    }
    return l;
}